

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

bool __thiscall
Memory::HeapBlockMap32::
RescanHeapBlockOnOOM<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>>
          (HeapBlockMap32 *this,
          SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *heapBlock,char *pageAddress,
          HeapBlockType blockType,uint bucketIndex,L2MapChunk *chunk,Recycler *recycler)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint localObjectSize;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  undefined8 *in_FS_OFFSET;
  BVStatic<2048UL> *local_40;
  
  if (heapBlock == (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x46d,"(heapBlock != nullptr)","heapBlock != nullptr");
    if (!bVar3) goto LAB_00218366;
    *puVar1 = 0;
  }
  if ((heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
      super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.heapBlockType !=
      blockType) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x46e,"(heapBlock->GetHeapBlockType() == blockType)",
                       "heapBlock->GetHeapBlockType() == blockType");
    if (!bVar3) goto LAB_00218366;
    *puVar1 = 0;
  }
  pcVar8 = (heapBlock->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
           super_SmallHeapBlockT<MediumAllocationBlockAttributes>.super_HeapBlock.address;
  if (this->map[(ulong)pcVar8 >> 0x14 & 0xfff] == (L2MapChunk *)0x0) {
    local_40 = (BVStatic<2048UL> *)0x0;
  }
  else {
    local_40 = BVStatic<65536ul>::GetRange<2048ul>
                         ((BVStatic<65536ul> *)this->map[(ulong)pcVar8 >> 0x14 & 0xfff],
                          (uint)pcVar8 >> 4 & 0xff00);
  }
  pcVar8 = (char *)((ulong)pageAddress & 0xffffffffffff8000);
  if (pcVar8 != pageAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x474,"(blockStartAddress == pageAddress)",
                       "blockStartAddress == pageAddress");
    if (!bVar3) {
LAB_00218366:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  uVar5 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetPageCount
                    ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
  uVar6 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetUnusablePageCount
                    ((SmallHeapBlockT<MediumAllocationBlockAttributes> *)heapBlock);
  uVar9 = uVar5 - uVar6;
  if (0 < (int)uVar9) {
    localObjectSize = bucketIndex * 0x100 + 0x400;
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    uVar7 = 0;
    bVar3 = false;
    do {
      if (0x1cff < (ulong)localObjectSize - 0x301) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar1 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.h"
                           ,0x2ef,
                           "(IsMediumObject(HeapConstants::MaxSmallObjectSize + ((bucketIndex + 1) * HeapConstants::MediumObjectGranularity)))"
                           ,
                           "IsMediumObject(HeapConstants::MaxSmallObjectSize + ((bucketIndex + 1) * HeapConstants::MediumObjectGranularity))"
                          );
        if (!bVar4) goto LAB_00218366;
        *puVar1 = 0;
      }
      bVar4 = SmallNormalHeapBucketBase<Memory::SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>_>
              ::RescanObjectsOnPage
                        (heapBlock,pcVar8 + (uint)((int)uVar7 << 0xc),pcVar8,local_40,
                         localObjectSize,bucketIndex,(bool *)0x0,recycler);
      if (!bVar4) {
        HeapBlock::SetNeedOOMRescan((HeapBlock *)heapBlock,recycler);
      }
      bVar4 = Recycler::NeedOOMRescan(recycler);
      if (bVar4) {
        return bVar3;
      }
      uVar7 = uVar7 + 1;
      bVar3 = uVar9 <= uVar7;
    } while (uVar7 != uVar9);
  }
  this->anyHeapBlockRescannedDuringOOM = true;
  return true;
}

Assistant:

bool
HeapBlockMap32::RescanHeapBlockOnOOM(TBlockType* heapBlock, char* pageAddress, HeapBlock::HeapBlockType blockType, uint bucketIndex, L2MapChunk * chunk, Recycler * recycler)
{
    // In the OOM codepath, we expect the heap block to be dereferenced since perf is not critical
    Assert(heapBlock != nullptr);
    Assert(heapBlock->GetHeapBlockType() == blockType);
    auto markBits = this->GetMarkBitVectorForPages<TBlockType::HeapBlockAttributes::BitVectorCount>(heapBlock->GetAddress());
    char* blockStartAddress = TBlockType::GetBlockStartAddress(pageAddress);

    // Rescan all pages in this block
    // The following assert makes sure that this method is called only once per heap block
    Assert(blockStartAddress == pageAddress);

    int inUsePageCount = heapBlock->GetPageCount() - heapBlock->GetUnusablePageCount();
    for (int i = 0; i < inUsePageCount; i++)
    {
        char* pageAddressToScan = blockStartAddress + (i * AutoSystemInfo::PageSize);

        if (!SmallNormalHeapBucketBase<TBlockType>::RescanObjectsOnPage(heapBlock,
            pageAddressToScan, blockStartAddress, markBits, HeapInfo::template GetObjectSizeForBucketIndex<typename TBlockType::HeapBlockAttributes>(bucketIndex), bucketIndex, nullptr, recycler))
        {
            // Failed due to OOM
            ((TBlockType*)heapBlock)->SetNeedOOMRescan(recycler);
        }

        if (recycler->NeedOOMRescan())
        {
            // We hit OOM again.  Don't try to process any more blocks, leave them for the next OOM pass.
            return false;
        }
    }

    this->anyHeapBlockRescannedDuringOOM = true;

    return true;
}